

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

uint64_t __thiscall fmp4_stream::media_fragment::get_duration(media_fragment *this)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  
  uVar1 = (ulong)(this->trex_).default_sample_duration_;
  uVar2 = (ulong)*(uint *)&(this->trun_).super_full_box.field_0x6c;
  if (uVar2 != 0) {
    puVar3 = &((this->trun_).m_sentry.
               super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
               ._M_impl.super__Vector_impl_data._M_start)->sample_duration_;
    do {
      puVar4 = &(this->tfhd_).default_sample_duration_;
      if ((this->trun_).sample_duration_present_ != false) {
        puVar4 = puVar3;
      }
      uVar1 = uVar1 + *puVar4;
      puVar3 = puVar3 + 8;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return uVar1;
}

Assistant:

uint64_t media_fragment::get_duration()
	{
		uint64_t duration = this->trex_.default_sample_duration_;

		for (unsigned int i = 0; i < trun_.sample_count_; i++)
		{
			uint32_t sample_duration = tfhd_.default_sample_duration_;
			if (trun_.sample_duration_present_)
			{
				sample_duration = trun_.m_sentry[i].sample_duration_;
			}
			else if (tfhd_.default_sample_duration_present_)
				sample_duration = tfhd_.default_sample_duration_;
			
			duration += sample_duration;
		}
		return duration;
	}